

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O0

bool_t ecpIsSafeGroup(ec_o *ec,size_t mov_threshold,void *stack)

{
  bool_t bVar1;
  int iVar2;
  size_t n;
  word *mod;
  word *in_RDX;
  word *in_RSI;
  word *in_RDI;
  word *t2;
  word *t1;
  size_t n1;
  word *in_stack_00000030;
  word *b;
  word *b_00;
  bool_t local_4;
  
  n = *(long *)(in_RDI[3] + 0x30) + 1;
  b = in_RDX + n;
  b_00 = b + n;
  mod = (word *)wwWordSize((word *)in_RDI[7],n);
  bVar1 = priIsPrime(in_RDX,(size_t)b,(void *)0x159a6d);
  if (bVar1 == 0) {
    local_4 = 0;
  }
  else {
    iVar2 = wwCmp2(in_RDI,(size_t)in_RSI,b_00,(size_t)mod);
    if (iVar2 == 0) {
      local_4 = 0;
    }
    else if (in_RSI == (word *)0x0) {
LAB_00159b97:
      local_4 = 1;
    }
    else {
      zzMod(in_stack_00000030,(word *)ec,mov_threshold,(word *)stack,n1,t1);
      wwCopy(b,in_RDX,(size_t)mod);
      iVar2 = wwCmpW(b_00,(size_t)mod,(word)in_RDX);
      if (iVar2 == 0) {
        local_4 = 0;
      }
      else {
        do {
          in_RSI = (word *)((long)in_RSI + -1);
          if (in_RSI == (word *)0x0) goto LAB_00159b97;
          zzMulMod(in_RDI,in_RSI,b_00,mod,(size_t)in_RDX,b);
          iVar2 = wwCmpW(b_00,(size_t)mod,(word)in_RDX);
        } while (iVar2 != 0);
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

bool_t ecpIsSafeGroup(const ec_o* ec, size_t mov_threshold, void* stack)
{
	size_t n1 = ec->f->n + 1;
	// переменные в stack
	word* t1 = (word*)stack;
	word* t2 = t1 + n1;
	stack = t2 + n1;
	// pre
	ASSERT(ecIsOperable(ec));
	ASSERT(ecIsOperableGroup(ec));
	// order -- простое?
	n1 = wwWordSize(ec->order, n1);
	if (!priIsPrime(ec->order, n1, stack))
		return FALSE;
	// order == p?
	if (wwCmp2(ec->f->mod, ec->f->n, ec->order, n1) == 0)
		return FALSE;
	// проверка MOV
	if (mov_threshold)
	{
		zzMod(t1, ec->f->mod, ec->f->n, ec->order, n1, stack);
		wwCopy(t2, t1, n1);
		if (wwCmpW(t2, n1, 1) == 0)
			return FALSE;
		while (--mov_threshold)
		{
			zzMulMod(t2, t2, t1, ec->order, n1, stack);
			if (wwCmpW(t2, n1, 1) == 0)
				return FALSE;
		}
	}
	// все нормально
	return TRUE;
}